

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

DWORD VIRTUALConvertVirtualFlags(BYTE VirtualProtect)

{
  undefined4 local_10;
  DWORD MemAccessControl;
  BYTE VirtualProtect_local;
  
  if (VirtualProtect == '\x01') {
    local_10 = 2;
  }
  else if (VirtualProtect == '\x02') {
    local_10 = 4;
  }
  else if (VirtualProtect == '\x03') {
    local_10 = 0x40;
  }
  else if (VirtualProtect == '\x06') {
    local_10 = 0x20;
  }
  else if (VirtualProtect == '\x05') {
    local_10 = 0x10;
  }
  else if (VirtualProtect == '\x04') {
    local_10 = 1;
  }
  else {
    local_10 = 0;
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
  }
  return local_10;
}

Assistant:

static DWORD VIRTUALConvertVirtualFlags( IN BYTE VirtualProtect )
{
    DWORD MemAccessControl = 0;

    if ( VirtualProtect == VIRTUAL_READONLY )
    {
        MemAccessControl = PAGE_READONLY;
    }
    else if ( VirtualProtect == VIRTUAL_READWRITE )
    {
        MemAccessControl = PAGE_READWRITE;
    }
    else if ( VirtualProtect == VIRTUAL_EXECUTE_READWRITE )
    {
        MemAccessControl = PAGE_EXECUTE_READWRITE;
    }
    else if ( VirtualProtect == VIRTUAL_EXECUTE_READ )
    {
        MemAccessControl = PAGE_EXECUTE_READ;
    }
    else if ( VirtualProtect == VIRTUAL_EXECUTE )
    {
        MemAccessControl = PAGE_EXECUTE;
    }
    else if ( VirtualProtect == VIRTUAL_NOACCESS )
    {
        MemAccessControl = PAGE_NOACCESS;
    }

    else
    {
        MemAccessControl = 0;
        ERROR( "Incorrect or no protection flags specified.\n" );
    }
    return MemAccessControl;
}